

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi.cc
# Opt level: O2

size_t ixxx::ansi::strftime(char *__s,size_t __maxsize,char *__format,tm *__tp)

{
  size_t sVar1;
  strftime_error *this;
  int *piVar2;
  
  sVar1 = ::strftime(__s,__maxsize,__format,__tp);
  if (sVar1 != 0) {
    return sVar1;
  }
  this = (strftime_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  strftime_error::sys_error(this,*piVar2,"destination buffer too small",ERRNO);
  __cxa_throw(this,&strftime_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

size_t strftime(char *s, size_t max, const char *format, const struct tm *tm)
    {
      size_t r = ::strftime(s, max, format, tm);
      if (!r)
          throw strftime_error(errno, "destination buffer too small");
      return r;
    }